

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::norm16HasDecompBoundaryAfter(Normalizer2Impl *this,uint16_t norm16)

{
  ushort uVar1;
  undefined2 uVar2;
  UBool UVar3;
  
  UVar3 = '\x01';
  if ((this->minYesNo < norm16) && (uVar2 = this->minYesNoMappingsOnly, (uVar2 | 1) != norm16)) {
    if (this->limitNoNo <= norm16) {
      if (norm16 < this->minMaybeYes) {
        return (norm16 & 6) < 3;
      }
      return norm16 == 0xfe00 || norm16 < 0xfc01;
    }
    uVar1 = *(ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffe));
    if (uVar1 < 0x200) {
      if ((char)uVar1 < '\0' && 0xff < uVar1) {
        return this->extraData[(ulong)(norm16 >> 1) - 1] < 0x100;
      }
    }
    else {
      UVar3 = '\0';
    }
  }
  return UVar3;
}

Assistant:

UBool Normalizer2Impl::norm16HasDecompBoundaryAfter(uint16_t norm16) const {
    if(norm16 <= minYesNo || isHangulLVT(norm16)) {
        return TRUE;
    }
    if (norm16 >= limitNoNo) {
        if (isMaybeOrNonZeroCC(norm16)) {
            return norm16 <= MIN_NORMAL_MAYBE_YES || norm16 == JAMO_VT;
        }
        // Maps to an isCompYesAndZeroCC.
        return (norm16 & DELTA_TCCC_MASK) <= DELTA_TCCC_1;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    // decomp after-boundary: same as hasFCDBoundaryAfter(),
    // fcd16<=1 || trailCC==0
    if(firstUnit>0x1ff) {
        return FALSE;  // trailCC>1
    }
    if(firstUnit<=0xff) {
        return TRUE;  // trailCC==0
    }
    // if(trailCC==1) test leadCC==0, same as checking for before-boundary
    // TRUE if leadCC==0 (hasFCDBoundaryBefore())
    return (firstUnit&MAPPING_HAS_CCC_LCCC_WORD)==0 || (*(mapping-1)&0xff00)==0;
}